

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

SourceContextInfo * __thiscall
Js::ScriptContext::CreateSourceContextInfo
          (ScriptContext *this,DWORD_PTR sourceContext,char16 *url,size_t len,
          SimpleDataCacheWrapper *dataCacheWrapper,char16 *sourceMapUrl,size_t sourceMapUrlLen)

{
  code *pcVar1;
  AutoCriticalSection str;
  bool bVar2;
  uint uVar3;
  ThreadContext *this_00;
  CriticalSection *cs;
  SourceContextInfo *pSVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  ArenaAllocator *pAVar7;
  char16 *pcVar8;
  SourceDynamicProfileManager *ptr;
  SourceDynamicProfileManager **ppSVar9;
  Cache *pCVar10;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  nullptr_t local_98;
  code *local_90;
  undefined8 local_88;
  TrackAllocData local_80;
  SourceContextInfo *local_58;
  SourceContextInfo *sourceContextInfo;
  AutoCriticalSection local_40;
  AutoCriticalSection autocs;
  char16 *sourceMapUrl_local;
  SimpleDataCacheWrapper *dataCacheWrapper_local;
  size_t len_local;
  char16 *url_local;
  DWORD_PTR sourceContext_local;
  ScriptContext *this_local;
  
  autocs.cs = (CriticalSection *)sourceMapUrl;
  url_local = (char16 *)sourceContext;
  sourceContext_local = (DWORD_PTR)this;
  this_00 = GetThreadContext(this);
  cs = ThreadContext::GetFunctionBodyLock(this_00);
  AutoCriticalSection::AutoCriticalSection(&local_40,cs);
  EnsureSourceContextInfoMap(this);
  pSVar4 = GetSourceContextInfo(this,(DWORD_PTR)url_local,dataCacheWrapper);
  if (pSVar4 != (SourceContextInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xbe4,
                                "(this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr)"
                                ,
                                "this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pRVar6 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,(type_info *)&SourceContextInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0xbe5);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_80);
  local_90 = Memory::Recycler::AllocZeroInlined;
  local_88 = 0;
  pSVar4 = (SourceContextInfo *)new<Memory::Recycler>(0x38,pRVar6,0x744a10);
  SourceContextInfo::SourceContextInfo(pSVar4);
  local_58 = pSVar4;
  uVar3 = GetNextSourceContextId(this);
  local_58->sourceContextId = uVar3;
  local_58->dwHostSourceContext = (Type)url_local;
  local_58->isHostDynamicDocument = false;
  local_98 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::SourceDynamicProfileManager>::operator=
            (&local_58->sourceDynamicProfileManager,&local_98);
  if (url != (char16 *)0x0) {
    pAVar7 = SourceCodeAllocator(this);
    pcVar8 = CopyString(url,len,pAVar7);
    (local_58->field_5).field_0.url = pcVar8;
  }
  str.cs = autocs.cs;
  if ((autocs.cs != (CriticalSection *)0x0) && (sourceMapUrlLen != 0)) {
    pAVar7 = SourceCodeAllocator(this);
    pcVar8 = CopyString((char16 *)str.cs,sourceMapUrlLen,pAVar7);
    (local_58->field_5).field_0.sourceMapUrl = pcVar8;
  }
  if ((this->startupComplete & 1U) == 0) {
    ptr = SourceDynamicProfileManager::LoadFromDynamicProfileStorage(local_58,this,dataCacheWrapper)
    ;
    Memory::WriteBarrierPtr<Js::SourceDynamicProfileManager>::operator=
              (&local_58->sourceDynamicProfileManager,ptr);
    ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SourceDynamicProfileManager__
                        ((WriteBarrierPtr *)&local_58->sourceDynamicProfileManager);
    if (*ppSVar9 == (SourceDynamicProfileManager *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0xbfb,
                                  "(sourceContextInfo->sourceDynamicProfileManager != __null)",
                                  "sourceContextInfo->sourceDynamicProfileManager != NULL");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  pCVar10 = Cache(this);
  this_01 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&pCVar10->sourceContextInfoMap);
  JsUtil::
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Add(this_01,(unsigned_long *)&url_local,&local_58);
  pSVar4 = local_58;
  AutoCriticalSection::~AutoCriticalSection(&local_40);
  return pSVar4;
}

Assistant:

SourceContextInfo * ScriptContext::CreateSourceContextInfo(DWORD_PTR sourceContext, char16 const * url, size_t len,
        SimpleDataCacheWrapper* dataCacheWrapper, char16 const * sourceMapUrl /*= NULL*/, size_t sourceMapUrlLen /*= 0*/)
    {
        // Take etw rundown lock on this thread context. We are going to init/add to sourceContextInfoMap.
        AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());

        EnsureSourceContextInfoMap();
        Assert(this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr);
        SourceContextInfo * sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->sourceContextId = this->GetNextSourceContextId();
        sourceContextInfo->dwHostSourceContext = sourceContext;
        sourceContextInfo->isHostDynamicDocument = false;
#if ENABLE_PROFILE_INFO
        sourceContextInfo->sourceDynamicProfileManager = nullptr;
#endif

        if (url != nullptr)
        {
            sourceContextInfo->url = CopyString(url, len, this->SourceCodeAllocator());
            JS_ETW(EtwTrace::LogSourceModuleLoadEvent(this, sourceContext, url));
        }
        if (sourceMapUrl != nullptr && sourceMapUrlLen != 0)
        {
            sourceContextInfo->sourceMapUrl = CopyString(sourceMapUrl, sourceMapUrlLen, this->SourceCodeAllocator());
        }

#if ENABLE_PROFILE_INFO
        if (!this->startupComplete)
        {
            sourceContextInfo->sourceDynamicProfileManager = SourceDynamicProfileManager::LoadFromDynamicProfileStorage(sourceContextInfo, this, dataCacheWrapper);
            Assert(sourceContextInfo->sourceDynamicProfileManager != NULL);
        }

        this->Cache()->sourceContextInfoMap->Add(sourceContext, sourceContextInfo);
#endif
        return sourceContextInfo;
    }